

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O2

void scan_bitstream_mx(TrackData *trackdata)

{
  DataRate datarate_;
  bool bVar1;
  byte bVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  int iVar5;
  uint uVar6;
  int size_;
  BitBuffer *this;
  LogHelper *pLVar7;
  ulong uVar8;
  ushort uVar9;
  bool bVar10;
  uint8_t lsb;
  uint local_e0;
  uint local_dc;
  TrackData *local_d8;
  undefined8 local_d0;
  Data block;
  Track track;
  Sector sector;
  uint8_t msb;
  
  Track::Track(&track,0);
  block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8 = trackdata;
  this = TrackData::bitstream(trackdata);
  BitBuffer::seek(this,0);
  this->encoding = FM;
  track.tracklen = BitBuffer::track_bitsize(this);
  local_d0 = 0;
  uVar8 = 0;
  bVar10 = false;
  while (bVar1 = BitBuffer::wrapped(this), !bVar1) {
    iVar5 = Track::size(&track);
    if (iVar5 == 0) {
      iVar5 = BitBuffer::tell(this);
      if ((bool)(track.tracklen < iVar5 | bVar10)) break;
    }
    else if (bVar10) break;
    bVar2 = BitBuffer::read1(this);
    uVar8 = uVar8 * 2 | (ulong)bVar2;
    if (uVar8 == 0x88888888aaaa88aa) {
      if (opt.debug != 0) {
        pLVar7 = util::operator<<((LogHelper *)&util::cout,(char (*) [24])"  s_b_mx found sync at ")
        ;
        sector.header.cyl = BitBuffer::tell(this);
        pLVar7 = util::operator<<(pLVar7,(int *)&sector);
        util::operator<<(pLVar7,(char (*) [2])0x1a83c6);
      }
      uVar3 = BitBuffer::read_byte(this);
      uVar4 = BitBuffer::read_byte(this);
      local_dc = (uint)CONCAT11(uVar3,uVar4);
      uVar6 = 0;
      while (uVar6 != 0xb) {
        datarate_ = this->datarate;
        iVar5 = (local_d8->cylhead).head;
        local_e0 = uVar6;
        size_ = SizeToCode(0x100);
        Header::Header((Header *)&msb,local_dc,iVar5,local_e0,size_);
        Sector::Sector(&sector,datarate_,MX,(Header *)&msb,0);
        iVar5 = BitBuffer::tell(this);
        sector.offset = BitBuffer::track_offset(this,iVar5);
        if (block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        iVar5 = 0x80;
        uVar9 = 0;
        while (bVar10 = iVar5 != 0, iVar5 = iVar5 + -1, bVar10) {
          msb = BitBuffer::read_byte(this);
          bVar2 = BitBuffer::read_byte(this);
          uVar3 = msb;
          lsb = bVar2;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    (&block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&lsb);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    (&block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                     (value_type *)&msb);
          uVar9 = uVar9 + bVar2 + (ushort)uVar3 * 0x100;
        }
        uVar3 = BitBuffer::read_byte(this);
        uVar4 = BitBuffer::read_byte(this);
        if (opt.debug != 0) {
          util::fmt_abi_cxx11_
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msb,
                     "cksum s %2d disk:calc %06o:%06o (%04x:%04x)\n",(ulong)local_e0,
                     (ulong)(uint)CONCAT11(uVar3,uVar4),(ulong)(uint)uVar9,
                     (ulong)(uint)CONCAT11(uVar3,uVar4),(uint)uVar9);
          util::operator<<((LogHelper *)&util::cout,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msb
                          );
          std::__cxx11::string::~string((string *)&msb);
        }
        if (uVar9 == CONCAT11(uVar3,uVar4)) {
          Sector::add(&sector,&block,(bool)(uVar9 == 0 & (byte)local_d0),'\0');
        }
        else {
          Sector::add(&sector,&block,true,'\0');
          local_d0 = CONCAT71((int7)((ulong)local_d0 >> 8),
                              (byte)local_d0 | CONCAT11(uVar3,uVar4) == 0);
        }
        Track::add(&track,&sector);
        std::vector<Data,_std::allocator<Data>_>::~vector(&sector.m_data);
        uVar6 = local_e0 + 1;
      }
      uVar3 = BitBuffer::read_byte(this);
      uVar4 = BitBuffer::read_byte(this);
      bVar10 = true;
      uVar8 = 0x88888888aaaa88aa;
      if (opt.debug != 0) {
        util::fmt_abi_cxx11_
                  ((string *)&sector,"  s_b_mx c:h %d:%d stored %d extra %06o\n",
                   (ulong)(uint)(local_d8->cylhead).cyl,(ulong)(uint)(local_d8->cylhead).head,
                   (ulong)local_dc,(ulong)CONCAT11(uVar3,uVar4));
        util::operator<<((LogHelper *)&util::cout,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &sector);
        std::__cxx11::string::~string((string *)&sector);
        uVar8 = 0x88888888aaaa88aa;
      }
    }
  }
  TrackData::add(local_d8,&track);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&block);
  std::vector<Sector,_std::allocator<Sector>_>::~vector(&track.m_sectors);
  return;
}

Assistant:

void scan_bitstream_mx(TrackData& trackdata)
{
    Track track;
    Data block;
    uint64_t dword = 0;
    uint16_t stored_cksum = 0, cksum = 0, stored_track = 0, extra = 0;
    bool zero_cksum = false;

    auto& bitbuf = trackdata.bitstream();
    bitbuf.seek(0);
    bitbuf.encoding = Encoding::FM;
    track.tracklen = bitbuf.track_bitsize();
    bool sync = false;

    while (!bitbuf.wrapped())
    {
        // Give up if no headers were found in the first revolution
        if (!track.size() && bitbuf.tell() > track.tracklen)
            break;

        // ignore sync sequences after first one
        if (sync)
            break;

        dword = (dword << 1) | bitbuf.read1();

        switch (dword)
        {
        case 0x88888888aaaa88aa:    // FM-encoded 0x00f3 (000363 octal)
            sync = true;
            if (opt.debug)
                util::cout << "  s_b_mx found sync at " << bitbuf.tell() << "\n";
            break;

        default:
            continue;
        }

        // skip track number
        stored_track = bitbuf.read_byte() << 8;
        stored_track |= bitbuf.read_byte();

        // read sectors
        for (auto s = 0; s < 11; s++) {
            Sector sector(bitbuf.datarate, Encoding::MX, Header(stored_track, trackdata.cylhead.head, s, SizeToCode(256)));
            sector.offset = bitbuf.track_offset(bitbuf.tell());

            block.clear();
            cksum = 0;

            for (auto i = 0; i < 128; i++) {
                auto msb = bitbuf.read_byte();
                auto lsb = bitbuf.read_byte();
                cksum += (lsb | (msb << 8));
                block.push_back(lsb);
                block.push_back(msb);
            }

            stored_cksum = bitbuf.read_byte() << 8;
            stored_cksum |= bitbuf.read_byte();

            if (opt.debug)
                util::cout << util::fmt("cksum s %2d disk:calc %06o:%06o (%04x:%04x)\n",
                    s, stored_cksum, cksum, stored_cksum, cksum);

            /*
             * Flux stream on some marginal disks may decode as stream of zero bits instead of valid
             * data, but checksum of all zeros is also zero...
             */
            if (cksum != stored_cksum)
            {
                sector.add(std::move(block), true, 0);
                if (stored_cksum == 0)
                {
                    zero_cksum = true;
                }
            }
            else
            {
                sector.add(std::move(block), (zero_cksum && stored_cksum == 0), 0);
            }
            track.add(std::move(sector));
        }

        extra = bitbuf.read_byte() << 8;
        extra |= bitbuf.read_byte();

        if (opt.debug)
            util::cout << util::fmt("  s_b_mx c:h %d:%d stored %d extra %06o\n",
                trackdata.cylhead.cyl, trackdata.cylhead.head, stored_track, extra);
    }

    trackdata.add(std::move(track));
}